

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void SGParser::Generator::FollowPos
               (RegExprDFANode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *nodelist)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  bool bVar2;
  reference ppRVar3;
  iterator __first;
  iterator __last;
  byte local_b9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  const_iterator local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  uint *local_88;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  uint *local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  uint *local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  RegExprDFANode *local_28;
  RegExprDFANode *pnode;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvStack_18;
  bool done;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nodelist_local;
  RegExprDFANode *node_local;
  
  pnode._7_1_ = 0;
  local_28 = node->pParent;
  pvStack_18 = (vector<unsigned_int,std::allocator<unsigned_int>> *)nodelist;
  nodelist_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)node;
  while( true ) {
    local_b9 = 0;
    if (local_28 != (RegExprDFANode *)0x0) {
      local_b9 = pnode._7_1_ ^ 0xff;
    }
    if ((local_b9 & 1) == 0) break;
    bVar2 = std::operator==(&local_28->LastPos,nodelist_local + 3);
    if (bVar2) {
      local_28 = local_28->pParent;
    }
    else {
      if (local_28->Type == And) {
        ppRVar3 = std::
                  vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ::operator[](&local_28->Children,0);
        local_38._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&(*ppRVar3)->LastPos);
        ppRVar3 = std::
                  vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ::operator[](&local_28->Children,0);
        local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     (&(*ppRVar3)->LastPos);
        local_30 = std::
                   find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                             (local_38,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        )local_40,
                              (uint *)&(nodelist_local->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish);
        ppRVar3 = std::
                  vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ::operator[](&local_28->Children,0);
        local_48._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&(*ppRVar3)->LastPos);
        bVar2 = __gnu_cxx::operator!=(&local_30,&local_48);
        pvVar1 = pvStack_18;
        if (bVar2) {
          local_58._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18)
          ;
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_50,&local_58);
          ppRVar3 = std::
                    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                    ::operator[](&local_28->Children,1);
          local_60._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&(*ppRVar3)->FirstPos);
          ppRVar3 = std::
                    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                    ::operator[](&local_28->Children,1);
          local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                       (&(*ppRVar3)->FirstPos);
          local_70 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                       (pvVar1,local_50,local_60,
                                        (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         )local_68);
        }
        else {
          pnode._7_1_ = 1;
        }
      }
      else if (local_28->Type == Star) {
        local_80._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&local_28->LastPos);
        local_88 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     (&local_28->LastPos);
        local_78 = std::
                   find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                             (local_80,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        )local_88,
                              (uint *)&(nodelist_local->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish);
        local_90._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&local_28->LastPos);
        bVar2 = __gnu_cxx::operator!=(&local_78,&local_90);
        pvVar1 = pvStack_18;
        if (bVar2) {
          local_a0._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvStack_18)
          ;
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_98,&local_a0);
          __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                              (&local_28->FirstPos);
          __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&local_28->FirstPos);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    (pvVar1,local_98,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__last._M_current);
        }
        else {
          pnode._7_1_ = 1;
        }
      }
      local_28 = local_28->pParent;
    }
  }
  return;
}

Assistant:

void FollowPos(const RegExprDFANode& node, std::vector<unsigned>& nodelist) {
    bool done  = false;
    auto pnode = node.pParent;

    while (pnode && !done) {
        if (pnode->LastPos == node.LastPos) {
            pnode = pnode->pParent;
            continue;
        }

        switch (pnode->Type) {
            case RegExprDFANode::NodeType::And:
                if (std::find(pnode->Children[0u]->LastPos.begin(),
                              pnode->Children[0u]->LastPos.end(), node.Position) !=
                    pnode->Children[0u]->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->Children[1u]->FirstPos.begin(),
                                    pnode->Children[1u]->FirstPos.end());
                else
                    done = true;
                break;

            case RegExprDFANode::NodeType::Star:
                if (std::find(pnode->LastPos.begin(), pnode->LastPos.end(), node.Position) !=
                    pnode->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->FirstPos.begin(),
                                    pnode->FirstPos.end());
                else
                    done = true;
                break;

            default:
                break;
        }

        pnode = pnode->pParent;
    }
}